

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_string_field_lite.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::RepeatedImmutableStringFieldLiteGenerator::GenerateMembers
          (RepeatedImmutableStringFieldLiteGenerator *this,Printer *printer)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables;
  
  variables = &this->variables_;
  io::Printer::Print(printer,variables,
                     "private com.google.protobuf.Internal.ProtobufList<String> $name$_;\n");
  PrintExtraFieldInfo(variables,printer);
  WriteFieldDocComment(printer,this->descriptor_);
  io::Printer::Print(printer,variables,
                     "$deprecation$public java.util.List<String> get$capitalized_name$List() {\n  return $name$_;\n}\n"
                    );
  WriteFieldDocComment(printer,this->descriptor_);
  io::Printer::Print(printer,variables,
                     "$deprecation$public int get$capitalized_name$Count() {\n  return $name$_.size();\n}\n"
                    );
  WriteFieldDocComment(printer,this->descriptor_);
  io::Printer::Print(printer,variables,
                     "$deprecation$public java.lang.String get$capitalized_name$(int index) {\n  return $name$_.get(index);\n}\n"
                    );
  WriteFieldDocComment(printer,this->descriptor_);
  io::Printer::Print(printer,variables,
                     "$deprecation$public com.google.protobuf.ByteString\n    get$capitalized_name$Bytes(int index) {\n  return com.google.protobuf.ByteString.copyFromUtf8(\n      $name$_.get(index));\n}\n"
                    );
  io::Printer::Print(printer,variables,
                     "private void ensure$capitalized_name$IsMutable() {\n  if (!$is_mutable$) {\n    $name$_ =\n        com.google.protobuf.GeneratedMessageLite.mutableCopy($name$_);\n   }\n}\n"
                    );
  WriteFieldDocComment(printer,this->descriptor_);
  io::Printer::Print(printer,variables,
                     "private void set$capitalized_name$(\n    int index, java.lang.String value) {\n$null_check$  ensure$capitalized_name$IsMutable();\n  $name$_.set(index, value);\n}\n"
                    );
  WriteFieldDocComment(printer,this->descriptor_);
  io::Printer::Print(printer,variables,
                     "private void add$capitalized_name$(\n    java.lang.String value) {\n$null_check$  ensure$capitalized_name$IsMutable();\n  $name$_.add(value);\n}\n"
                    );
  WriteFieldDocComment(printer,this->descriptor_);
  io::Printer::Print(printer,variables,
                     "private void addAll$capitalized_name$(\n    java.lang.Iterable<java.lang.String> values) {\n  ensure$capitalized_name$IsMutable();\n  com.google.protobuf.AbstractMessageLite.addAll(\n      values, $name$_);\n}\n"
                    );
  WriteFieldDocComment(printer,this->descriptor_);
  io::Printer::Print(printer,variables,
                     "private void clear$capitalized_name$() {\n  $name$_ = $empty_list$;\n}\n");
  WriteFieldDocComment(printer,this->descriptor_);
  io::Printer::Print(printer,variables,
                     "private void add$capitalized_name$Bytes(\n    com.google.protobuf.ByteString value) {\n$null_check$"
                    );
  if ((*(int *)(*(long *)(this->descriptor_ + 0x30) + 0x8c) == 3) ||
     (*(char *)(*(long *)(*(long *)(this->descriptor_ + 0x30) + 0xa0) + 0xa2) == '\x01')) {
    io::Printer::Print(printer,variables,"  checkByteStringIsUtf8(value);\n");
  }
  io::Printer::Print(printer,variables,
                     "  ensure$capitalized_name$IsMutable();\n  $name$_.add(value.toStringUtf8());\n}\n"
                    );
  return;
}

Assistant:

void RepeatedImmutableStringFieldLiteGenerator::
GenerateMembers(io::Printer* printer) const {
  printer->Print(variables_,
    "private com.google.protobuf.Internal.ProtobufList<String> $name$_;\n");
  PrintExtraFieldInfo(variables_, printer);
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "$deprecation$public java.util.List<String> get$capitalized_name$List() {\n"
    "  return $name$_;\n"   // note:  unmodifiable list
    "}\n");
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "$deprecation$public int get$capitalized_name$Count() {\n"
    "  return $name$_.size();\n"
    "}\n");
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "$deprecation$public java.lang.String get$capitalized_name$(int index) {\n"
    "  return $name$_.get(index);\n"
    "}\n");
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "$deprecation$public com.google.protobuf.ByteString\n"
    "    get$capitalized_name$Bytes(int index) {\n"
    "  return com.google.protobuf.ByteString.copyFromUtf8(\n"
    "      $name$_.get(index));\n"
    "}\n");

  printer->Print(variables_,
    "private void ensure$capitalized_name$IsMutable() {\n"
    "  if (!$is_mutable$) {\n"
    "    $name$_ =\n"
    "        com.google.protobuf.GeneratedMessageLite.mutableCopy($name$_);\n"
    "   }\n"
    "}\n");

  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "private void set$capitalized_name$(\n"
    "    int index, java.lang.String value) {\n"
    "$null_check$"
    "  ensure$capitalized_name$IsMutable();\n"
    "  $name$_.set(index, value);\n"
    "}\n");
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "private void add$capitalized_name$(\n"
    "    java.lang.String value) {\n"
    "$null_check$"
    "  ensure$capitalized_name$IsMutable();\n"
    "  $name$_.add(value);\n"
    "}\n");
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "private void addAll$capitalized_name$(\n"
    "    java.lang.Iterable<java.lang.String> values) {\n"
    "  ensure$capitalized_name$IsMutable();\n"
    "  com.google.protobuf.AbstractMessageLite.addAll(\n"
    "      values, $name$_);\n"
    "}\n");
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "private void clear$capitalized_name$() {\n"
    "  $name$_ = $empty_list$;\n"
    "}\n");

  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "private void add$capitalized_name$Bytes(\n"
    "    com.google.protobuf.ByteString value) {\n"
    "$null_check$");
  if (CheckUtf8(descriptor_)) {
    printer->Print(variables_,
      "  checkByteStringIsUtf8(value);\n");
  }
  printer->Print(variables_,
    "  ensure$capitalized_name$IsMutable();\n"
    "  $name$_.add(value.toStringUtf8());\n"
    "}\n");
}